

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

nes_controller_state on_nes_input(int controller_id,void *client)

{
  byte bVar1;
  short sVar2;
  long lVar3;
  int is_ctrl_down;
  uint8_t *keys;
  void *client_local;
  int controller_id_local;
  nes_controller_state state;
  
  client_local._0_4_ = controller_id;
  memset((void *)((long)&client_local + 7),0,1);
  if ((int)client_local == 0) {
    lVar3 = SDL_GetKeyboardState(0);
    if (*(char *)(lVar3 + 0xe0) == '\0' && *(char *)(lVar3 + 0xe4) == '\0') {
      client_local._7_1_ =
           (nes_controller_state)
           ((*(byte *)(lVar3 + 0x1a) & 1) << 3 | (*(byte *)(lVar3 + 0x16) & 1) << 2 |
            (*(byte *)(lVar3 + 4) & 1) << 1 | *(byte *)(lVar3 + 7) & 1 | *(char *)(lVar3 + 0xd) << 7
            | (*(byte *)(lVar3 + 0xe) & 1) << 6 | (*(byte *)(lVar3 + 0x2b) & 1) << 5 |
           (*(byte *)(lVar3 + 0x28) & 1) << 4);
    }
    if (controller[0] != (SDL_GameController *)0x0) {
      bVar1 = SDL_GameControllerGetButton(controller[0],0xb);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xf7 | ((byte)client_local._7_1_ >> 3 & 1 | bVar1 & 1) << 3);
      bVar1 = SDL_GameControllerGetButton(controller[0],0xc);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xfb | ((byte)client_local._7_1_ >> 2 & 1 | bVar1 & 1) << 2);
      bVar1 = SDL_GameControllerGetButton(controller[0],0xd);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xfd | ((byte)client_local._7_1_ >> 1 & 1 | bVar1 & 1) << 1);
      bVar1 = SDL_GameControllerGetButton(controller[0],0xe);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xfe | (byte)client_local._7_1_ & 1 | bVar1 & 1);
      bVar1 = SDL_GameControllerGetButton(controller[0],0);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0x7f | ((byte)client_local._7_1_ >> 7 | bVar1) << 7);
      bVar1 = SDL_GameControllerGetButton(controller[0],1);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xbf | ((byte)client_local._7_1_ >> 6 & 1 | bVar1 & 1) << 6);
      bVar1 = SDL_GameControllerGetButton(controller[0],4);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xdf | ((byte)client_local._7_1_ >> 5 & 1 | bVar1 & 1) << 5);
      bVar1 = SDL_GameControllerGetButton(controller[0],6);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xef | ((byte)client_local._7_1_ >> 4 & 1 | bVar1 & 1) << 4);
      sVar2 = SDL_GameControllerGetAxis(controller[0],0);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xfd |
           ((byte)client_local._7_1_ >> 1 & 1 | sVar2 < -0x800) << 1);
      sVar2 = SDL_GameControllerGetAxis(controller[0],0);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xfe | (byte)client_local._7_1_ & 1 | 0x800 < sVar2);
      sVar2 = SDL_GameControllerGetAxis(controller[0],1);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xf7 |
           ((byte)client_local._7_1_ >> 3 & 1 | sVar2 < -0x800) << 3);
      sVar2 = SDL_GameControllerGetAxis(controller[0],1);
      client_local._7_1_ =
           (nes_controller_state)
           ((byte)client_local._7_1_ & 0xfb |
           ((byte)client_local._7_1_ >> 2 & 1 | 0x800 < sVar2) << 2);
    }
  }
  return client_local._7_1_;
}

Assistant:

nes_controller_state on_nes_input(int controller_id, void* client)
{
    nes_controller_state state;
    memset(&state, 0, sizeof(nes_controller_state));

    if (controller_id == 0)
    {
        const uint8_t* keys = SDL_GetKeyboardState(0);
        int is_ctrl_down = keys[SDL_SCANCODE_LCTRL] | keys[SDL_SCANCODE_RCTRL];
        if (!is_ctrl_down)
        {
            state.up    = keys[SDL_SCANCODE_W];
            state.down  = keys[SDL_SCANCODE_S];
            state.left  = keys[SDL_SCANCODE_A];
            state.right = keys[SDL_SCANCODE_D];
            state.A     = keys[SDL_SCANCODE_J];
            state.B     = keys[SDL_SCANCODE_K];
            state.select = keys[SDL_SCANCODE_TAB];
            state.start  = keys[SDL_SCANCODE_RETURN];
        }

        if (controller[0])
        {
            state.up     |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_UP); 
            state.down   |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_DOWN); 
            state.left   |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_LEFT); 
            state.right  |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_RIGHT); 
            state.A      |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_A); 
            state.B      |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_B); 
            state.select |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_BACK); 
            state.start  |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_START); 

            state.left  |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTX) < -CONTROLLER_DEADZONE;
            state.right |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTX) > CONTROLLER_DEADZONE;
            state.up    |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTY) < -CONTROLLER_DEADZONE;
            state.down  |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTY) > CONTROLLER_DEADZONE;
        }
    }

    return state;
}